

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O2

string * __thiscall
Tools::double_to_string_abi_cxx11_(string *__return_storage_ptr__,Tools *this,double d)

{
  ostringstream ss;
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 5;
  std::ostream::_M_insert<double>(d);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return __return_storage_ptr__;
}

Assistant:

std::string Tools::double_to_string(double d) {
    std::ostringstream ss;
    ss << std::fixed << std::setprecision(PRECISION);
    ss << d;
    std::string s = ss.str();
    return s;
}